

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O1

golf_model_t * golf_entity_get_model(golf_entity_t *entity)

{
  golf_model_t *pgVar1;
  
  switch(entity->type) {
  case MODEL_ENTITY:
    pgVar1 = (entity->field_4).model.model;
    break;
  case BALL_START_ENTITY:
    pgVar1 = golf_data_get_model("data/models/editor/ball_start.obj");
    return pgVar1;
  case HOLE_ENTITY:
    pgVar1 = golf_data_get_model("data/models/hole.obj");
    return pgVar1;
  case GEO_ENTITY:
    pgVar1 = (golf_model_t *)((long)&entity->field_4 + 0x108);
    break;
  case WATER_ENTITY:
    pgVar1 = (golf_model_t *)((long)&entity->field_4 + 0xe0);
    break;
  default:
    pgVar1 = (golf_model_t *)0x0;
  }
  return pgVar1;
}

Assistant:

golf_model_t *golf_entity_get_model(golf_entity_t *entity) {
    switch (entity->type) {
        case MODEL_ENTITY: {
            return entity->model.model;
        }
        case HOLE_ENTITY: {
            return golf_data_get_model("data/models/hole.obj");
        }
        case BALL_START_ENTITY: {
            return golf_data_get_model("data/models/editor/ball_start.obj");
        }
        case GEO_ENTITY: {
            return &entity->geo.geo.model;
        }
        case WATER_ENTITY: {
            return &entity->water.geo.model;
        }
        case CAMERA_ZONE_ENTITY:
        case BEGIN_ANIMATION_ENTITY:
        case GROUP_ENTITY: {
            return NULL;
        }
    }
    return NULL;
}